

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

hash hash_callback_ptr(hash_key key)

{
  ulong uVar1;
  uintptr_t x;
  
  uVar1 = ((ulong)key >> 0x1e ^ (ulong)key) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  return uVar1 >> 0x1f ^ uVar1;
}

Assistant:

hash hash_callback_ptr(const hash_key key)
{
	/* https://stackoverflow.com/a/12996028 */
	uintptr_t x = (uintptr_t)key;

#if UINTPTR_MAX == 0xFFFFFFFF
	/* 32-bit */
	x = ((x >> 16) ^ x) * 0x45D9F3B;
	x = ((x >> 16) ^ x) * 0x45D9F3B;
	x = (x >> 16) ^ x;
#elif UINTPTR_MAX == 0xFFFFFFFFFFFFFFFF
	/* 64-bit */
	x = (x ^ (x >> 30)) * UINT64_C(0xBF58476D1CE4E5B9);
	x = (x ^ (x >> 27)) * UINT64_C(0x94D049BB133111EB);
	x = x ^ (x >> 31);
#else
	#error "Architecture not implemented for hash function"
#endif

	return x;
}